

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O0

int process_options(int cnt,char **args)

{
  int iVar1;
  size_t sVar2;
  long in_RSI;
  undefined4 in_EDI;
  int flag;
  
  do {
    iVar1 = __posix_getopt(in_EDI,in_RSI,"ab:cdhi:n:Nl:o:p:r:s:t:vx");
    if (iVar1 == -1) {
      return 0;
    }
    switch(iVar1) {
    case 0x4e:
      flags = flags | 0x4000;
      break;
    default:
      printf("unknown option \'%s\' ignored\n",*(undefined8 *)(in_RSI + (long)_optind * 8));
      usage();
      exit(1);
    case 0x61:
      flags = flags | 0x200;
      break;
    case 0x62:
      sVar2 = strlen(_optarg);
      d_path = (char *)malloc((long)((int)sVar2 + 1));
      if (d_path == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x122);
        exit(1);
      }
      strcpy(d_path,_optarg);
      break;
    case 99:
      flags = flags | 0x800;
      break;
    case 100:
      flags = flags | 1;
      break;
    case 0x68:
      usage();
      exit(0);
    case 0x69:
      sVar2 = strlen(_optarg);
      ifile = (char *)malloc((long)((int)sVar2 + 1));
      if (ifile == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x131);
        exit(1);
      }
      strcpy(ifile,_optarg);
      flags = flags | 0x1000;
      break;
    case 0x6c:
      sVar2 = strlen(_optarg);
      lfile = (char *)malloc((long)((int)sVar2 + 1));
      if (lfile == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x137);
        exit(1);
      }
      strcpy(lfile,_optarg);
      flags = flags | 0x40;
      break;
    case 0x6e:
      sVar2 = strlen(_optarg);
      db_name = (char *)malloc((long)((int)sVar2 + 1));
      if (db_name == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x140);
        exit(1);
      }
      strcpy(db_name,_optarg);
      flags = flags | 8;
      break;
    case 0x6f:
      sVar2 = strlen(_optarg);
      osuff = (char *)malloc((long)((int)sVar2 + 1));
      if (osuff == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x146);
        exit(1);
      }
      strcpy(osuff,_optarg);
      flags = flags | 2;
      break;
    case 0x70:
      snum = atoi(_optarg);
      break;
    case 0x72:
      flags = flags | 0x400;
      rndm = atol(_optarg);
      break;
    case 0x73:
      flt_scale = atof(_optarg);
      if (100000.0 < (double)scale) {
        fprintf(_stderr,"%s %5.0f %s\n%s\n",0x40f86a0000000000,
                "WARNING: Support for scale factors >","GB is still in development.",
                "Data set integrity is not guaranteed.\n");
      }
      break;
    case 0x74:
      sVar2 = strlen(_optarg);
      tfile = (char *)malloc((long)((int)sVar2 + 1));
      if (tfile == (char *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
                ,0x15c);
        exit(1);
      }
      strcpy(tfile,_optarg);
      flags = flags | 0x2000;
      break;
    case 0x76:
      flags = flags | 0x10;
      break;
    case 0x78:
      flags = flags | 4;
    }
  } while( true );
}

Assistant:

int
process_options(int cnt, char **args)
{
    int flag;

    while((flag = getopt(cnt, args, "ab:cdhi:n:Nl:o:p:r:s:t:vx")) != -1)
        switch(flag)
            {
            case 'a':   /* use ANSI semantics */
                flags |= ANSI;
                break;
			case 'b':               /* load distributions from named file */
				d_path = (char *)malloc((int)strlen(optarg) + 1);
				MALLOC_CHECK(d_path);
				strcpy(d_path, optarg);
				break;
			case 'c':   /* retain comments in EQT */
                flags |= COMMENT;
                break;
            case 'd':   /* use default substitution values */
                flags |= DFLT;
                break;
            case 'h':   /* just generate the usage summary */
                usage();
                exit(0);
                break;
            case 'i':   /* set stream initialization file name */
                ifile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(ifile);
                strcpy(ifile, optarg);
                flags |= INIT;
                break;
            case 'l':   /* log parameter usages */
                lfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(lfile);
                strcpy(lfile, optarg);
                flags |= LOG;
                break;
            case 'N':   /* use default rowcounts */
                flags |= DFLT_NUM;
                break;
            case 'n':   /* set database name */
                db_name = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(db_name);
                strcpy(db_name, optarg);
                flags |= DBASE;
                break;
            case 'o':   /* set the output path */
                osuff = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(osuff);
                strcpy(osuff, optarg);
                flags |=OUTPUT;
                break;
            case 'p':   /* permutation for a given stream */
                snum = atoi(optarg);
                break;
            case 'r':   /* set random number seed for parameter gen */
                flags |= SEED;
                rndm = atol(optarg);
                break;
            case 's':   /* scale of data set to run against */
                flt_scale = atof(optarg);
				if (scale > MAX_SCALE)
					fprintf(stderr, "%s %5.0f %s\n%s\n",
						"WARNING: Support for scale factors >",
						MAX_SCALE,
						"GB is still in development.",
						"Data set integrity is not guaranteed.\n");
                break;
            case 't':   /* set termination file name */
                tfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(tfile);
                strcpy(tfile, optarg);
                flags |= TERMINATE;
                break;
            case 'v':   /* verbose */
                flags |= VERBOSE;
                break;
            case 'x':   /* set explain in the queries */
                flags |= EXPLAIN;
                break;
            default:
                printf("unknown option '%s' ignored\n", args[optind]);
                usage();
                exit(1);
                break;
            }
    return(0);
}